

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  BrotliEncoderDictionary *pBVar8;
  void *pvVar9;
  void *pvVar10;
  HasherCommon *pHVar11;
  BrotliDictionary *pBVar12;
  int iVar13;
  bool bVar14;
  ushort uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  uint8_t *puVar23;
  ulong *puVar24;
  uint uVar25;
  int iVar26;
  size_t sVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  uint32_t *addr_4;
  long lVar31;
  uint8_t *puVar32;
  char cVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  size_t sVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint16_t uVar42;
  uint32_t uVar43;
  uint uVar44;
  uint uVar45;
  long lVar46;
  uint8_t *s1_orig_1;
  ulong *puVar47;
  ulong uVar48;
  uint8_t *s1_orig_3;
  ulong *puVar49;
  uint8_t *puVar50;
  size_t sVar51;
  ushort uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong local_168;
  ulong local_158;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  int local_11c;
  size_t local_118;
  ulong local_110;
  ulong local_100;
  uint local_e8;
  int local_e4;
  Command *local_e0;
  ulong local_c8;
  ulong local_b8;
  ulong local_b0;
  ulong local_80;
  
  uVar5 = (position - 3) + num_bytes;
  sVar27 = position;
  if (3 < num_bytes) {
    sVar27 = uVar5;
  }
  lVar28 = 0x200;
  if (params->quality < 9) {
    lVar28 = 0x40;
  }
  local_118 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_e0 = commands;
LAB_00310c7d:
    *last_insert_len = (local_118 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
    return;
  }
  uVar35 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar6 = params->stream_offset;
  sVar7 = (params->dictionary).compound.total_size;
  local_c8 = lVar28 + position;
  lVar16 = sVar7 + 1;
  lVar4 = position - 1;
  local_e0 = commands;
  sVar38 = position;
LAB_0030f868:
  uVar30 = uVar35;
  if (sVar38 < uVar35) {
    uVar30 = sVar38;
  }
  uVar17 = sVar6 + sVar38;
  if (uVar35 <= sVar6 + sVar38) {
    uVar17 = uVar35;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_e8 = 0;
    local_b0 = 0;
    goto LAB_0030f8ed;
  }
  if (sVar38 == 0) {
    local_b0 = 0;
LAB_0030f8c8:
    uVar20 = 0;
  }
  else {
    local_b0 = (ulong)ringbuffer[sVar38 - 1 & ringbuffer_mask];
    if (sVar38 == 1) goto LAB_0030f8c8;
    uVar20 = (ulong)ringbuffer[sVar38 - 2 & ringbuffer_mask];
  }
  local_e8 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar20 + 0x100] | literal_context_lut[local_b0]];
LAB_0030f8ed:
  uVar53 = uVar1 - sVar38;
  pBVar8 = (params->dictionary).contextual.dict[local_e8];
  uVar20 = (params->dist).max_distance;
  pvVar9 = (hasher->privat)._H40.extra[0];
  pvVar10 = (hasher->privat)._H40.extra[1];
  uVar18 = sVar38 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar18);
  uVar34 = (uint)(*(int *)(ringbuffer + uVar18) * 0x1e35a7bd) >> 0x11;
  local_110 = 0x7e4;
  local_138 = 0;
  lVar29 = 0;
  local_158 = 0;
  local_168 = 0;
LAB_0030f961:
  uVar39 = (ulong)dist_cache[lVar29];
  uVar22 = sVar38 - uVar39;
  cVar33 = (char)uVar34;
  if ((((lVar29 == 0) || (*(char *)((long)pvVar9 + (uVar22 & 0xffff) + 0x30000) == cVar33)) &&
      (uVar39 <= uVar30)) && (uVar22 < sVar38)) {
    puVar23 = ringbuffer + (uVar22 & ringbuffer_mask);
    uVar22 = uVar53;
    puVar47 = puVar2;
    puVar50 = puVar23;
    if (7 < uVar53) {
      lVar46 = 0;
      lVar19 = 0;
LAB_0030f9b5:
      if (*(ulong *)((long)puVar2 + lVar46) == *(ulong *)(puVar23 + lVar46)) goto code_r0x0030f9c3;
      uVar54 = *(ulong *)(puVar23 + lVar46) ^ *(ulong *)((long)puVar2 + lVar46);
      uVar22 = 0;
      if (uVar54 != 0) {
        for (; (uVar54 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar22 = (uVar22 >> 3 & 0x1fffffff) - lVar19;
      goto LAB_0030fa30;
    }
    goto LAB_0030f9e8;
  }
  goto LAB_0030fa86;
code_r0x0030f9c3:
  lVar46 = lVar46 + 8;
  lVar31 = uVar53 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar31 - 8U < 8) goto code_r0x0030f9d9;
  goto LAB_0030f9b5;
code_r0x0030f9d9:
  puVar50 = puVar23 + -lVar19;
  puVar47 = (ulong *)((long)puVar2 - lVar19);
  uVar22 = lVar19 + uVar53;
LAB_0030f9e8:
  if (uVar22 != 0) {
    uVar54 = 0;
    do {
      uVar40 = uVar54;
      if (puVar50[uVar54] != *(uint8_t *)((long)puVar47 + uVar54)) break;
      uVar54 = uVar54 + 1;
      uVar40 = uVar22;
    } while (uVar22 != uVar54);
    puVar50 = puVar50 + uVar40;
  }
  uVar22 = (long)puVar50 - (long)puVar23;
LAB_0030fa30:
  if ((1 < uVar22) && (uVar54 = uVar22 * 0x87 + 0x78f, local_110 < uVar54)) {
    if (lVar29 != 0) {
      uVar54 = uVar54 - ((0x1ca10U >> ((byte)lVar29 & 2) & 4) + 0x27);
    }
    if (local_110 < uVar54) {
      local_168 = uVar39;
      local_158 = uVar22;
      local_138 = uVar22;
      local_110 = uVar54;
    }
  }
LAB_0030fa86:
  lVar29 = lVar29 + 1;
  if (lVar29 == 4) goto code_r0x0030fa93;
  goto LAB_0030f961;
code_r0x0030fa93:
  uVar22 = (ulong)uVar34;
  sVar51 = (hasher->privat)._H5.block_size_;
  uVar39 = sVar38 - *(uint *)((long)pvVar9 + uVar22 * 4);
  if (sVar51 != 0) {
    uVar52 = *(ushort *)((long)pvVar9 + uVar22 * 2 + 0x20000);
    uVar40 = 0;
    uVar54 = uVar39;
LAB_0030fad7:
    uVar40 = uVar54 + uVar40;
    if (uVar40 <= uVar30) {
      if (uVar18 + local_138 <= ringbuffer_mask) {
        uVar48 = sVar38 - uVar40 & ringbuffer_mask;
        uVar54 = uVar48 + local_138;
        if ((ringbuffer_mask < uVar54) || (ringbuffer[uVar18 + local_138] != ringbuffer[uVar54]))
        goto LAB_0030fbab;
        puVar23 = ringbuffer + uVar48;
        puVar50 = puVar23;
        uVar54 = uVar53;
        puVar47 = puVar2;
        if (7 < uVar53) {
          lVar29 = 0;
          lVar19 = 0;
LAB_0030fb3e:
          if (*(ulong *)((long)puVar2 + lVar29) == *(ulong *)(puVar23 + lVar29))
          goto code_r0x0030fb4c;
          uVar48 = *(ulong *)(puVar23 + lVar29) ^ *(ulong *)((long)puVar2 + lVar29);
          uVar54 = 0;
          if (uVar48 != 0) {
            for (; (uVar48 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
            }
          }
          uVar54 = (uVar54 >> 3 & 0x1fffffff) - lVar19;
          goto LAB_0030fbea;
        }
        goto LAB_0030fb78;
      }
      goto LAB_0030fbab;
    }
  }
LAB_0030fc2b:
  uVar52 = (hasher->privat)._H42.free_slot_idx[0];
  (hasher->privat)._H42.free_slot_idx[0] = uVar52 + 1;
  if (0xfffe < uVar39) {
    uVar39 = 0xffff;
  }
  *(char *)((long)pvVar9 + (sVar38 & 0xffff) + 0x30000) = cVar33;
  *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar39;
  *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
       *(undefined2 *)((long)pvVar9 + uVar22 * 2 + 0x20000);
  *(int *)((long)pvVar9 + uVar22 * 4) = (int)sVar38;
  *(ushort *)((long)pvVar9 + uVar22 * 2 + 0x20000) = uVar52;
  if (local_110 == 0x7e4) {
    pHVar11 = (hasher->privat)._H5.common_;
    uVar30 = pHVar11->dict_num_lookups;
    local_138 = pHVar11->dict_num_matches;
    if (uVar30 >> 7 <= local_138) {
      uVar18 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar50 = pBVar8->hash_table_lengths;
      local_110 = 0x7e4;
      local_11c = 0;
      bVar37 = true;
LAB_0030fd08:
      uVar30 = uVar30 + 1;
      pHVar11->dict_num_lookups = uVar30;
      bVar21 = puVar50[uVar18];
      uVar22 = (ulong)bVar21;
      if ((uVar22 != 0) && (uVar22 <= uVar53)) {
        pBVar12 = pBVar8->words;
        puVar24 = (ulong *)(pBVar12->data +
                           (ulong)pBVar12->offsets_by_length[uVar22] +
                           pBVar8->hash_table_words[uVar18] * uVar22);
        puVar47 = puVar2;
        uVar39 = uVar22;
        if (7 < bVar21) {
          lVar29 = 0;
LAB_0030fd7a:
          if (*puVar24 == *puVar47) goto code_r0x0030fd86;
          uVar54 = *puVar47 ^ *puVar24;
          uVar39 = 0;
          if (uVar54 != 0) {
            for (; (uVar54 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar29;
          goto LAB_0030fdf6;
        }
        goto LAB_0030fdad;
      }
      goto LAB_0030fd2e;
    }
  }
  else {
    local_11c = 0;
LAB_0030feed:
    if (0x7e4 < local_110) {
      uVar30 = local_118 + 4;
      lVar29 = (lVar4 + num_bytes) - sVar38;
      local_e4 = 0;
      local_80 = local_168;
      uVar52 = (hasher->privat)._H42.free_slot_idx[0];
LAB_0030ff4e:
      uVar53 = uVar53 - 1;
      local_168 = local_158 - 1;
      if (uVar53 <= local_158 - 1) {
        local_168 = uVar53;
      }
      if (4 < params->quality) {
        local_168 = 0;
      }
      uVar17 = sVar38 + 1;
      uVar20 = uVar35;
      if (uVar17 < uVar35) {
        uVar20 = uVar17;
      }
      local_b8 = sVar6 + sVar38 + 1;
      if (uVar35 <= local_b8) {
        local_b8 = uVar35;
      }
      if ((params->dictionary).contextual.context_based != 0) {
        local_e8 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[local_b0 + 0x100] |
                          literal_context_lut[ringbuffer[sVar38 & ringbuffer_mask]]];
        local_b0 = (ulong)ringbuffer[sVar38 & ringbuffer_mask];
      }
      pBVar8 = (params->dictionary).contextual.dict[local_e8];
      uVar18 = (params->dist).max_distance;
      pvVar9 = (hasher->privat)._H40.extra[0];
      pvVar10 = (hasher->privat)._H40.extra[1];
      uVar39 = uVar17 & ringbuffer_mask;
      puVar2 = (ulong *)(ringbuffer + uVar39);
      uVar34 = (uint)(*(int *)(ringbuffer + uVar39) * 0x1e35a7bd) >> 0x11;
      uVar22 = 0x7e4;
      lVar19 = 0;
      local_140 = 0;
      local_148 = 0;
LAB_00310055:
      uVar40 = (ulong)dist_cache[lVar19];
      uVar54 = uVar17 - uVar40;
      cVar33 = (char)uVar34;
      if (((lVar19 == 0) || (*(char *)((long)pvVar9 + (uVar54 & 0xffff) + 0x30000) == cVar33)) &&
         ((uVar40 <= uVar20 && (uVar54 < uVar17)))) {
        puVar23 = ringbuffer + (uVar54 & ringbuffer_mask);
        puVar47 = puVar2;
        uVar54 = uVar53;
        puVar50 = puVar23;
        if (7 < uVar53) {
          lVar46 = 0;
          lVar31 = 0;
LAB_003100a7:
          if (*(ulong *)((long)puVar2 + lVar46) == *(ulong *)(puVar23 + lVar46))
          goto code_r0x003100b4;
          uVar48 = *(ulong *)(puVar23 + lVar46) ^ *(ulong *)((long)puVar2 + lVar46);
          uVar54 = 0;
          if (uVar48 != 0) {
            for (; (uVar48 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
            }
          }
          uVar54 = (uVar54 >> 3 & 0x1fffffff) - lVar31;
          goto LAB_0031012e;
        }
        goto LAB_003100e1;
      }
      goto LAB_0031017d;
    }
  }
  local_118 = local_118 + 1;
  position = sVar38 + 1;
  if (position <= local_c8) goto LAB_00310c0f;
  if ((uint)((int)lVar28 * 4) + local_c8 < position) {
    uVar30 = sVar38 + 0x11;
    if (uVar1 - 4 <= sVar38 + 0x11) {
      uVar30 = uVar1 - 4;
    }
    if (uVar30 <= position) goto LAB_00310c0f;
    pvVar9 = (hasher->privat)._H40.extra[0];
    pvVar10 = (hasher->privat)._H40.extra[1];
    uVar52 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar34 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar17 = (ulong)uVar34;
      uVar20 = position - *(uint *)((long)pvVar9 + uVar17 * 4);
      *(char *)((long)pvVar9 + (position & 0xffff) + 0x30000) = (char)uVar34;
      if (0xfffe < uVar20) {
        uVar20 = 0xffff;
      }
      uVar15 = uVar52 + 1;
      *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar20;
      *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
           *(undefined2 *)((long)pvVar9 + uVar17 * 2 + 0x20000);
      *(int *)((long)pvVar9 + uVar17 * 4) = (int)position;
      *(ushort *)((long)pvVar9 + uVar17 * 2 + 0x20000) = uVar52;
      local_118 = local_118 + 4;
      position = position + 4;
      uVar52 = uVar15;
    } while (position < uVar30);
  }
  else {
    uVar30 = sVar38 + 9;
    if (uVar5 <= sVar38 + 9) {
      uVar30 = uVar5;
    }
    if (uVar30 <= position) goto LAB_00310c0f;
    pvVar9 = (hasher->privat)._H40.extra[0];
    pvVar10 = (hasher->privat)._H40.extra[1];
    uVar52 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar34 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar17 = (ulong)uVar34;
      uVar20 = position - *(uint *)((long)pvVar9 + uVar17 * 4);
      *(char *)((long)pvVar9 + (position & 0xffff) + 0x30000) = (char)uVar34;
      if (0xfffe < uVar20) {
        uVar20 = 0xffff;
      }
      uVar15 = uVar52 + 1;
      *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar20;
      *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
           *(undefined2 *)((long)pvVar9 + uVar17 * 2 + 0x20000);
      *(int *)((long)pvVar9 + uVar17 * 4) = (int)position;
      *(ushort *)((long)pvVar9 + uVar17 * 2 + 0x20000) = uVar52;
      local_118 = local_118 + 2;
      position = position + 2;
      uVar52 = uVar15;
    } while (position < uVar30);
  }
LAB_00310bf1:
  (hasher->privat)._H42.free_slot_idx[0] = uVar15;
LAB_00310c0f:
  sVar38 = position;
  if (uVar1 <= position + 4) goto LAB_00310c7d;
  goto LAB_0030f868;
code_r0x0030fb4c:
  lVar29 = lVar29 + 8;
  lVar46 = uVar53 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar46 - 8U < 8) goto code_r0x0030fb67;
  goto LAB_0030fb3e;
code_r0x0030fb67:
  puVar50 = puVar23 + -lVar19;
  puVar47 = (ulong *)((long)puVar2 - lVar19);
  uVar54 = lVar19 + uVar53;
LAB_0030fb78:
  if (uVar54 != 0) {
    uVar48 = 0;
    do {
      uVar36 = uVar48;
      if (puVar50[uVar48] != *(uint8_t *)((long)puVar47 + uVar48)) break;
      uVar48 = uVar48 + 1;
      uVar36 = uVar54;
    } while (uVar54 != uVar48);
    puVar50 = puVar50 + uVar36;
  }
  uVar54 = (long)puVar50 - (long)puVar23;
LAB_0030fbea:
  if (3 < uVar54) {
    iVar26 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar48 = (ulong)(iVar26 * -0x1e + 0x780) + uVar54 * 0x87;
    if (local_110 < uVar48) {
      local_138 = uVar54;
      local_168 = uVar40;
      local_158 = uVar54;
      local_110 = uVar48;
    }
  }
LAB_0030fbab:
  uVar54 = (ulong)uVar52;
  uVar52 = *(ushort *)((long)pvVar10 + uVar54 * 4 + 2);
  uVar54 = (ulong)*(ushort *)((long)pvVar10 + uVar54 * 4);
  sVar51 = sVar51 - 1;
  if (sVar51 == 0) goto LAB_0030fc2b;
  goto LAB_0030fad7;
code_r0x0030fd86:
  puVar24 = puVar24 + 1;
  puVar47 = puVar47 + 1;
  lVar19 = uVar22 + lVar29;
  lVar29 = lVar29 + -8;
  if (lVar19 - 8U < 8) goto code_r0x0030fda0;
  goto LAB_0030fd7a;
code_r0x0030fda0:
  uVar39 = lVar29 + uVar22;
  if (lVar29 + uVar22 != 0) {
LAB_0030fdad:
    uVar54 = 0;
    do {
      uVar40 = uVar54;
      if (*(char *)((long)puVar47 + uVar54) != *(char *)((long)puVar24 + uVar54)) break;
      uVar54 = uVar54 + 1;
      uVar40 = uVar39;
    } while (uVar39 != uVar54);
    puVar47 = (ulong *)((long)puVar47 + uVar40);
  }
  uVar39 = (long)puVar47 - (long)puVar2;
LAB_0030fdf6:
  if (((uVar39 != 0) && (uVar22 < pBVar8->cutoffTransformsCount + uVar39)) &&
     (uVar22 = (ulong)pBVar8->hash_table_words[uVar18] + uVar17 + lVar16 +
               ((ulong)((uint)(pBVar8->cutoffTransforms >>
                              ((char)(uVar22 - uVar39) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar22 - uVar39) * 4 << (pBVar12->size_bits_by_length[uVar22] & 0x3f)),
     uVar22 <= uVar20)) {
    iVar26 = 0x1f;
    if ((uint)uVar22 != 0) {
      for (; (uint)uVar22 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar54 = (uVar39 * 0x87 - (ulong)(uint)(iVar26 * 0x1e)) + 0x780;
    if (local_110 <= uVar54) {
      local_11c = (uint)bVar21 - (int)uVar39;
      local_138 = local_138 + 1;
      pHVar11->dict_num_matches = local_138;
      local_168 = uVar22;
      local_158 = uVar39;
      local_110 = uVar54;
    }
  }
LAB_0030fd2e:
  uVar18 = uVar18 + 1;
  bVar14 = !bVar37;
  bVar37 = false;
  if (bVar14) goto LAB_0030feed;
  goto LAB_0030fd08;
code_r0x003100b4:
  lVar46 = lVar46 + 8;
  lVar3 = lVar29 + lVar31;
  lVar31 = lVar31 + -8;
  if (lVar3 - 8U < 8) goto code_r0x003100ca;
  goto LAB_003100a7;
code_r0x003100ca:
  puVar50 = puVar23 + -lVar31;
  puVar47 = (ulong *)((long)puVar2 - lVar31);
  uVar54 = lVar31 + lVar29;
LAB_003100e1:
  if (uVar54 != 0) {
    uVar48 = 0;
    do {
      uVar36 = uVar48;
      if (puVar50[uVar48] != *(uint8_t *)((long)puVar47 + uVar48)) break;
      uVar48 = uVar48 + 1;
      uVar36 = uVar54;
    } while (uVar54 != uVar48);
    puVar50 = puVar50 + uVar36;
  }
  uVar54 = (long)puVar50 - (long)puVar23;
LAB_0031012e:
  if ((1 < uVar54) && (uVar48 = uVar54 * 0x87 + 0x78f, uVar22 < uVar48)) {
    if (lVar19 != 0) {
      uVar48 = uVar48 - ((0x1ca10U >> ((byte)lVar19 & 2) & 4) + 0x27);
    }
    if (uVar22 < uVar48) {
      uVar22 = uVar48;
      local_168 = uVar54;
      local_148 = uVar40;
      local_140 = uVar54;
    }
  }
LAB_0031017d:
  lVar19 = lVar19 + 1;
  if (lVar19 == 4) goto code_r0x0031018a;
  goto LAB_00310055;
code_r0x0031018a:
  uVar54 = (ulong)uVar34;
  sVar51 = (hasher->privat)._H5.block_size_;
  uVar40 = uVar17 - *(uint *)((long)pvVar9 + uVar54 * 4);
  if (sVar51 != 0) {
    uVar15 = *(ushort *)((long)pvVar9 + uVar54 * 2 + 0x20000);
    uVar36 = 0;
    uVar48 = uVar40;
LAB_003101d1:
    uVar36 = uVar48 + uVar36;
    if (uVar36 <= uVar20) {
      if (uVar39 + local_168 <= ringbuffer_mask) {
        uVar41 = uVar17 - uVar36 & ringbuffer_mask;
        uVar48 = uVar41 + local_168;
        if ((ringbuffer_mask < uVar48) || (ringbuffer[uVar39 + local_168] != ringbuffer[uVar48]))
        goto LAB_00310298;
        puVar23 = ringbuffer + uVar41;
        uVar48 = uVar53;
        puVar50 = puVar23;
        puVar47 = puVar2;
        if (7 < uVar53) {
          lVar46 = 0;
          lVar19 = 0;
LAB_00310234:
          if (*(ulong *)((long)puVar2 + lVar46) == *(ulong *)(puVar23 + lVar46))
          goto code_r0x00310241;
          uVar41 = *(ulong *)(puVar23 + lVar46) ^ *(ulong *)((long)puVar2 + lVar46);
          uVar48 = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
            }
          }
          uVar48 = (uVar48 >> 3 & 0x1fffffff) - lVar19;
          goto LAB_003102ce;
        }
        goto LAB_00310266;
      }
      goto LAB_00310298;
    }
  }
LAB_0031030e:
  (hasher->privat)._H42.free_slot_idx[0] = uVar52 + 1;
  *(char *)((long)pvVar9 + (uVar17 & 0xffff) + 0x30000) = cVar33;
  if (0xfffe < uVar40) {
    uVar40 = 0xffff;
  }
  *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar40;
  *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
       *(undefined2 *)((long)pvVar9 + uVar54 * 2 + 0x20000);
  *(int *)((long)pvVar9 + uVar54 * 4) = (int)uVar17;
  *(ushort *)((long)pvVar9 + uVar54 * 2 + 0x20000) = uVar52;
  iVar26 = 0;
  if (uVar22 == 0x7e4) {
    pHVar11 = (hasher->privat)._H5.common_;
    uVar20 = pHVar11->dict_num_lookups;
    local_100 = pHVar11->dict_num_matches;
    uVar22 = 0x7e4;
    if (uVar20 >> 7 <= local_100) {
      uVar39 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar50 = pBVar8->hash_table_lengths;
      iVar26 = 0;
      uVar22 = 0x7e4;
      bVar37 = true;
LAB_0031047c:
      uVar20 = uVar20 + 1;
      pHVar11->dict_num_lookups = uVar20;
      bVar21 = puVar50[uVar39];
      uVar54 = (ulong)bVar21;
      if ((uVar54 != 0) && (uVar54 <= uVar53)) {
        pBVar12 = pBVar8->words;
        puVar24 = (ulong *)(pBVar12->data +
                           (ulong)pBVar12->offsets_by_length[uVar54] +
                           pBVar8->hash_table_words[uVar39] * uVar54);
        uVar40 = uVar54;
        puVar47 = puVar2;
        if (7 < bVar21) {
          lVar19 = 0;
          puVar49 = puVar2;
LAB_003104f6:
          if (*puVar24 == *puVar49) goto code_r0x00310502;
          uVar48 = *puVar49 ^ *puVar24;
          uVar40 = 0;
          if (uVar48 != 0) {
            for (; (uVar48 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          uVar40 = (uVar40 >> 3 & 0x1fffffff) - lVar19;
          goto LAB_0031055e;
        }
        goto LAB_00310529;
      }
      goto LAB_003104a4;
    }
  }
LAB_003103bb:
  if (uVar22 < local_110 + 0xaf) {
    uVar17 = sVar38;
    local_140 = local_158;
    sVar51 = local_118;
    local_b8 = sVar6 + sVar38;
    iVar26 = local_11c;
    if (uVar35 <= sVar6 + sVar38) {
      local_b8 = uVar35;
    }
    goto LAB_00310872;
  }
  local_80 = local_148;
  sVar51 = uVar30;
  if (local_e4 == 3) goto LAB_00310872;
  local_118 = local_118 + 1;
  local_e4 = local_e4 + 1;
  uVar20 = sVar38 + 5;
  lVar29 = lVar29 + -1;
  local_158 = local_140;
  sVar38 = uVar17;
  local_110 = uVar22;
  local_11c = iVar26;
  sVar51 = local_118;
  uVar52 = uVar52 + 1;
  if (uVar1 <= uVar20) goto LAB_00310872;
  goto LAB_0030ff4e;
code_r0x00310241:
  lVar46 = lVar46 + 8;
  lVar31 = lVar29 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar31 - 8U < 8) goto code_r0x00310257;
  goto LAB_00310234;
code_r0x00310257:
  puVar50 = puVar23 + -lVar19;
  puVar47 = (ulong *)((long)puVar2 - lVar19);
  uVar48 = lVar19 + lVar29;
LAB_00310266:
  puVar32 = puVar50;
  if (uVar48 != 0) {
    puVar32 = puVar50 + uVar48;
    uVar41 = 0;
    do {
      if (puVar50[uVar41] != *(uint8_t *)((long)puVar47 + uVar41)) {
        puVar32 = puVar50 + uVar41;
        break;
      }
      uVar41 = uVar41 + 1;
    } while (uVar48 != uVar41);
  }
  uVar48 = (long)puVar32 - (long)puVar23;
LAB_003102ce:
  if (3 < uVar48) {
    iVar26 = 0x1f;
    if ((uint)uVar36 != 0) {
      for (; (uint)uVar36 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar41 = (ulong)(iVar26 * -0x1e + 0x780) + uVar48 * 0x87;
    if (uVar22 < uVar41) {
      local_168 = uVar48;
      uVar22 = uVar41;
      local_148 = uVar36;
      local_140 = uVar48;
    }
  }
LAB_00310298:
  uVar48 = (ulong)uVar15;
  uVar15 = *(ushort *)((long)pvVar10 + uVar48 * 4 + 2);
  uVar48 = (ulong)*(ushort *)((long)pvVar10 + uVar48 * 4);
  sVar51 = sVar51 - 1;
  if (sVar51 == 0) goto LAB_0031030e;
  goto LAB_003101d1;
code_r0x00310502:
  puVar24 = puVar24 + 1;
  puVar49 = puVar49 + 1;
  lVar46 = uVar54 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar46 - 8U < 8) goto code_r0x0031051c;
  goto LAB_003104f6;
code_r0x0031051c:
  uVar40 = lVar19 + uVar54;
  puVar47 = puVar49;
  if (lVar19 + uVar54 != 0) {
LAB_00310529:
    puVar49 = (ulong *)(uVar40 + (long)puVar47);
    uVar48 = 0;
    do {
      if (*(char *)((long)puVar47 + uVar48) != *(char *)((long)puVar24 + uVar48)) {
        puVar49 = (ulong *)((long)puVar47 + uVar48);
        break;
      }
      uVar48 = uVar48 + 1;
    } while (uVar40 != uVar48);
  }
  uVar40 = (long)puVar49 - (long)puVar2;
LAB_0031055e:
  if (((uVar40 != 0) && (uVar54 < pBVar8->cutoffTransformsCount + uVar40)) &&
     (uVar54 = (ulong)pBVar8->hash_table_words[uVar39] + lVar16 + local_b8 +
               ((ulong)((uint)(pBVar8->cutoffTransforms >>
                              ((char)(uVar54 - uVar40) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar54 - uVar40) * 4 << (pBVar12->size_bits_by_length[uVar54] & 0x3f)),
     uVar54 <= uVar18)) {
    iVar13 = 0x1f;
    if ((uint)uVar54 != 0) {
      for (; (uint)uVar54 >> iVar13 == 0; iVar13 = iVar13 + -1) {
      }
    }
    uVar48 = (uVar40 * 0x87 - (ulong)(uint)(iVar13 * 0x1e)) + 0x780;
    if (uVar22 <= uVar48) {
      iVar26 = (uint)bVar21 - (int)uVar40;
      local_100 = local_100 + 1;
      pHVar11->dict_num_matches = local_100;
      local_148 = uVar54;
      local_140 = uVar40;
      uVar22 = uVar48;
    }
  }
LAB_003104a4:
  uVar39 = uVar39 + 1;
  bVar14 = !bVar37;
  bVar37 = false;
  if (bVar14) goto LAB_003103bb;
  goto LAB_0031047c;
LAB_00310872:
  local_118 = sVar51;
  local_b8 = local_b8 + sVar7;
  if (local_b8 < local_80) {
LAB_00310891:
    uVar30 = local_80 + 0xf;
LAB_00310895:
    if ((local_80 <= local_b8) && (uVar30 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)local_80;
    }
  }
  else {
    if (local_80 != (long)*dist_cache) {
      uVar30 = 1;
      if (local_80 != (long)dist_cache[1]) {
        uVar30 = (local_80 + 3) - (long)*dist_cache;
        if (uVar30 < 7) {
          bVar21 = (byte)((int)uVar30 << 2);
          uVar34 = 0x9750468;
        }
        else {
          uVar30 = (local_80 + 3) - (long)dist_cache[1];
          if (6 < uVar30) {
            uVar30 = 2;
            if ((local_80 != (long)dist_cache[2]) && (uVar30 = 3, local_80 != (long)dist_cache[3]))
            goto LAB_00310891;
            goto LAB_00310895;
          }
          bVar21 = (byte)((int)uVar30 << 2);
          uVar34 = 0xfdb1ace;
        }
        uVar30 = (ulong)(uVar34 >> (bVar21 & 0x1f) & 0xf);
      }
      goto LAB_00310895;
    }
    uVar30 = 0;
  }
  uVar34 = (uint)local_118;
  local_e0->insert_len_ = uVar34;
  local_e0->copy_len_ = iVar26 << 0x19 | (uint)local_140;
  uVar18 = (ulong)(params->dist).num_direct_distance_codes;
  uVar20 = uVar18 + 0x10;
  uVar43 = 0;
  if (uVar20 <= uVar30) {
    uVar45 = (params->dist).distance_postfix_bits;
    bVar21 = (byte)uVar45;
    uVar18 = ((uVar30 - uVar18) + (4L << (bVar21 & 0x3f))) - 0x10;
    uVar25 = 0x1f;
    uVar44 = (uint)uVar18;
    if (uVar44 != 0) {
      for (; uVar44 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar25 = (uVar25 ^ 0xffffffe0) + 0x1f;
    uVar53 = (ulong)((uVar18 >> ((ulong)uVar25 & 0x3f) & 1) != 0);
    lVar29 = (ulong)uVar25 - (ulong)uVar45;
    uVar30 = (~(-1 << (bVar21 & 0x1f)) & uVar44) + uVar20 +
             (uVar53 + lVar29 * 2 + 0xfffe << (bVar21 & 0x3f)) | lVar29 * 0x400;
    uVar43 = (uint32_t)(uVar18 - (uVar53 + 2 << ((byte)uVar25 & 0x3f)) >> (bVar21 & 0x3f));
  }
  local_e0->dist_prefix_ = (uint16_t)uVar30;
  local_e0->dist_extra_ = uVar43;
  if (5 < local_118) {
    if (local_118 < 0x82) {
      uVar34 = 0x1f;
      uVar45 = (uint)(local_118 - 2);
      if (uVar45 != 0) {
        for (; uVar45 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar34 = (int)(local_118 - 2 >> ((char)(uVar34 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar34 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_118 < 0x842) {
      uVar45 = 0x1f;
      if (uVar34 - 0x42 != 0) {
        for (; uVar34 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar34 = (uVar45 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar34 = 0x15;
      if (0x1841 < local_118) {
        uVar34 = (uint)(ushort)(0x17 - (local_118 < 0x5842));
      }
    }
  }
  uVar45 = iVar26 + (uint)local_140;
  if (uVar45 < 10) {
    uVar25 = uVar45 - 2;
  }
  else if (uVar45 < 0x86) {
    uVar45 = uVar45 - 6;
    uVar25 = 0x1f;
    if (uVar45 != 0) {
      for (; uVar45 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar25 = (uVar45 >> ((char)(uVar25 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar25 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar25 = 0x17;
    if (uVar45 < 0x846) {
      uVar25 = 0x1f;
      if (uVar45 - 0x46 != 0) {
        for (; uVar45 - 0x46 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar25 = (uVar25 ^ 0xffe0) + 0x2c;
    }
  }
  uVar52 = (ushort)uVar25;
  uVar42 = (uVar52 & 7) + ((ushort)uVar34 & 7) * 8;
  if ((((uVar30 & 0x3ff) == 0) && ((ushort)uVar34 < 8)) && (uVar52 < 0x10)) {
    if (7 < uVar52) {
      uVar42 = uVar42 + 0x40;
    }
  }
  else {
    iVar26 = ((uVar34 & 0xffff) >> 3) * 3 + ((uVar25 & 0xffff) >> 3);
    uVar42 = uVar42 + ((ushort)(0x520d40 >> ((char)iVar26 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar26 * 0x40 + 0x40;
  }
  local_e0->cmd_prefix_ = uVar42;
  *num_literals = *num_literals + local_118;
  position = uVar17 + local_140;
  uVar30 = sVar27;
  if (position < sVar27) {
    uVar30 = position;
  }
  uVar20 = uVar17 + 2;
  if (local_80 < local_140 >> 2) {
    uVar18 = position + local_80 * -4;
    if (uVar18 < uVar20) {
      uVar18 = uVar20;
    }
    uVar20 = uVar18;
    if (uVar30 < uVar18) {
      uVar20 = uVar30;
    }
  }
  local_c8 = uVar17 + lVar28 + local_140 * 2;
  local_e0 = local_e0 + 1;
  if (uVar30 <= uVar20) {
    local_118 = 0;
    goto LAB_00310c0f;
  }
  pvVar9 = (hasher->privat)._H40.extra[0];
  pvVar10 = (hasher->privat)._H40.extra[1];
  uVar52 = (hasher->privat)._H42.free_slot_idx[0];
  do {
    uVar34 = (uint)(*(int *)(ringbuffer + (uVar20 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar17 = (ulong)uVar34;
    uVar18 = uVar20 - *(uint *)((long)pvVar9 + uVar17 * 4);
    *(char *)((long)pvVar9 + (uVar20 & 0xffff) + 0x30000) = (char)uVar34;
    if (0xfffe < uVar18) {
      uVar18 = 0xffff;
    }
    uVar15 = uVar52 + 1;
    *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar18;
    *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
         *(undefined2 *)((long)pvVar9 + uVar17 * 2 + 0x20000);
    *(int *)((long)pvVar9 + uVar17 * 4) = (int)uVar20;
    *(ushort *)((long)pvVar9 + uVar17 * 2 + 0x20000) = uVar52;
    uVar20 = uVar20 + 1;
    uVar52 = uVar15;
  } while (uVar30 != uVar20);
  local_118 = 0;
  goto LAB_00310bf1;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}